

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

int FFSdecode_in_place(FFSContext iocontext,char *src,void **dest_ptr)

{
  int iVar1;
  FFSTypeHandle_conflict ioformat_00;
  long *in_RDX;
  FFSContext in_RSI;
  int ret;
  int header_size;
  FFSTypeHandle_conflict ioformat;
  int in_stack_00000134;
  void *in_stack_00000138;
  char *in_stack_00000140;
  FFSTypeHandle_conflict in_stack_00000148;
  FFSTypeHandle_conflict in_stack_ffffffffffffffc8;
  int local_4;
  
  ioformat_00 = FFSTypeHandle_from_encode(in_RSI,(char *)in_RDX);
  if (ioformat_00 == (FFSTypeHandle_conflict)0x0) {
    local_4 = 0;
  }
  else {
    iVar1 = check_conversion(in_stack_ffffffffffffffc8);
    if (iVar1 == 0) {
      *in_RDX = 0;
      local_4 = 0;
    }
    else {
      iVar1 = FFSheader_size(ioformat_00);
      local_4 = FFSinternal_decode(in_stack_00000148,in_stack_00000140,in_stack_00000138,
                                   in_stack_00000134);
      *in_RDX = (long)&in_RSI->fmc + (long)iVar1;
    }
  }
  return local_4;
}

Assistant:

extern int
FFSdecode_in_place(FFSContext iocontext, char *src, void **dest_ptr)
{
    FFSTypeHandle ioformat = FFSTypeHandle_from_encode(iocontext, src);
    int header_size;
    int ret;

    if (ioformat == NULL) {
	return 0;
    }
    if (!check_conversion(ioformat)) {
	*dest_ptr = NULL;
	return 0;
    }
    header_size = FFSheader_size(ioformat);
    ret = FFSinternal_decode(ioformat, src, src + header_size, 1);
    *dest_ptr = src + header_size;
    return ret;
}